

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O2

void __thiscall QAction::setIconText(QAction *this,QString *text)

{
  QString *s1;
  QActionPrivate *this_00;
  bool bVar1;
  
  this_00 = *(QActionPrivate **)&this->field_0x8;
  s1 = &this_00->iconText;
  bVar1 = ::comparesEqual(s1,text);
  if (bVar1) {
    return;
  }
  QString::operator=(s1,(QString *)text);
  QActionPrivate::sendDataChanged(this_00);
  return;
}

Assistant:

void QAction::setIconText(const QString &text)
{
    Q_D(QAction);
    if (d->iconText == text)
        return;

    d->iconText = text;
    d->sendDataChanged();
}